

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommychain.h
# Opt level: O0

void tommy_chain_merge_degenerated(tommy_chain *first,tommy_chain *second,undefined1 *cmp)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  undefined1 *cmp_local;
  tommy_chain *second_local;
  tommy_chain *first_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*(code *)cmp)(first->tail->data,second->head->data);
  if (iVar2 < 1) {
    tommy_chain_concat(first->tail,second->head);
    first->tail = second->tail;
  }
  else {
    iVar2 = (*(code *)cmp)(second->tail->data,first->head->data);
    if (iVar2 < 0) {
      tommy_chain_concat(second->tail,first->head);
      first->head = second->head;
    }
    else {
      tommy_chain_merge(first,second,cmp);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

tommy_inline void tommy_chain_merge_degenerated(tommy_chain* first, tommy_chain* second, tommy_compare_func* cmp)
{
	/* identify the condition first <= second */
	if (cmp(first->tail->data, second->head->data) <= 0) {
		tommy_chain_concat(first->tail, second->head);
		first->tail = second->tail;
		return;
	}

	/* identify the condition second < first */
	/* here we must be strict on comparison to keep the sort stable */
	if (cmp(second->tail->data, first->head->data) < 0) {
		tommy_chain_concat(second->tail, first->head);
		first->head = second->head;
		return;
	}

	tommy_chain_merge(first, second, cmp);
}